

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::BasicAllFormatsLoadStoreComputeStage::Run
          (BasicAllFormatsLoadStoreComputeStage *this)

{
  bool bVar1;
  int i;
  long lVar2;
  long lVar3;
  Vector<float,_4> local_30;
  Vector<float,_4> local_20;
  
  local_20.m_data[0] = 1.0;
  local_20.m_data[1] = 2.0;
  local_20.m_data[2] = 3.0;
  local_20.m_data[3] = 4.0;
  local_30.m_data[0] = 2.0;
  local_30.m_data[1] = 4.0;
  local_30.m_data[2] = 6.0;
  local_30.m_data[3] = 8.0;
  bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
          Read<tcu::Vector<float,4>>
                    ((BasicAllFormatsLoadStoreComputeStage *)this,0x8814,&local_20,&local_30,0x1908,
                     0x1406);
  lVar3 = -1;
  if (bVar1) {
    local_20.m_data[0] = 1.0;
    local_20.m_data[1] = 2.0;
    local_20.m_data[2] = 3.0;
    local_20.m_data[3] = 4.0;
    local_30.m_data[0] = 2.0;
    local_30.m_data[1] = 0.0;
    local_30.m_data[2] = 0.0;
    local_30.m_data[3] = 1.0;
    bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
            Read<tcu::Vector<float,4>>
                      ((BasicAllFormatsLoadStoreComputeStage *)this,0x822e,&local_20,&local_30,
                       0x1903,0x1406);
    if (bVar1) {
      local_20.m_data[0] = 1.0;
      local_20.m_data[1] = 2.0;
      local_20.m_data[2] = 3.0;
      local_20.m_data[3] = 4.0;
      local_30.m_data[0] = 2.0;
      local_30.m_data[1] = 4.0;
      local_30.m_data[2] = 6.0;
      local_30.m_data[3] = 8.0;
      bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
              Read<tcu::Vector<float,4>>
                        ((BasicAllFormatsLoadStoreComputeStage *)this,0x881a,&local_20,&local_30,
                         0x1908,0x1406);
      if (bVar1) {
        local_20.m_data[0] = 1.4013e-45;
        local_20.m_data[1] = -NAN;
        local_20.m_data[2] = 4.2039e-45;
        local_20.m_data[3] = -NAN;
        local_30.m_data[0] = 2.8026e-45;
        local_30.m_data[1] = -NAN;
        local_30.m_data[2] = 8.40779e-45;
        local_30.m_data[3] = -NAN;
        bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                Read<tcu::Vector<int,4>>
                          ((BasicAllFormatsLoadStoreComputeStage *)this,0x8d82,
                           (Vector<int,_4> *)&local_20,(Vector<int,_4> *)&local_30,0x8d99,0x1404);
        if (bVar1) {
          local_20.m_data[0] = 1.4013e-45;
          local_20.m_data[1] = -NAN;
          local_20.m_data[2] = 4.2039e-45;
          local_20.m_data[3] = -NAN;
          local_30.m_data[0] = 2.8026e-45;
          local_30.m_data[1] = 0.0;
          local_30.m_data[2] = 0.0;
          local_30.m_data[3] = 1.4013e-45;
          bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                  Read<tcu::Vector<int,4>>
                            ((BasicAllFormatsLoadStoreComputeStage *)this,0x8235,
                             (Vector<int,_4> *)&local_20,(Vector<int,_4> *)&local_30,0x8d94,0x1404);
          if (bVar1) {
            local_20.m_data[0] = 1.4013e-45;
            local_20.m_data[1] = -NAN;
            local_20.m_data[2] = 4.2039e-45;
            local_20.m_data[3] = -NAN;
            local_30.m_data[0] = 2.8026e-45;
            local_30.m_data[1] = -NAN;
            local_30.m_data[2] = 8.40779e-45;
            local_30.m_data[3] = -NAN;
            bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                    Read<tcu::Vector<int,4>>
                              ((BasicAllFormatsLoadStoreComputeStage *)this,0x8d88,
                               (Vector<int,_4> *)&local_20,(Vector<int,_4> *)&local_30,0x8d99,0x1402
                              );
            if (bVar1) {
              local_20.m_data[0] = 1.4013e-45;
              local_20.m_data[1] = -NAN;
              local_20.m_data[2] = 4.2039e-45;
              local_20.m_data[3] = -NAN;
              local_30.m_data[0] = 2.8026e-45;
              local_30.m_data[1] = -NAN;
              local_30.m_data[2] = 8.40779e-45;
              local_30.m_data[3] = -NAN;
              bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                      Read<tcu::Vector<int,4>>
                                ((BasicAllFormatsLoadStoreComputeStage *)this,0x8d8e,
                                 (Vector<int,_4> *)&local_20,(Vector<int,_4> *)&local_30,0x8d99,
                                 0x1400);
              if (bVar1) {
                local_20.m_data[0] = 0.0;
                local_20.m_data[1] = 1.4013e-45;
                local_20.m_data[2] = 2.8026e-45;
                local_20.m_data[3] = 4.2039e-45;
                local_30.m_data[0] = 0.0;
                local_30.m_data[1] = 2.8026e-45;
                local_30.m_data[2] = 5.60519e-45;
                local_30.m_data[3] = 8.40779e-45;
                bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                        Read<tcu::Vector<unsigned_int,4>>
                                  ((BasicAllFormatsLoadStoreComputeStage *)this,0x8d70,
                                   (Vector<unsigned_int,_4> *)&local_20,
                                   (Vector<unsigned_int,_4> *)&local_30,0x8d99,0x1405);
                if (bVar1) {
                  local_20.m_data[0] = 9.80909e-45;
                  local_20.m_data[1] = 2.8026e-45;
                  local_20.m_data[2] = 4.2039e-45;
                  local_20.m_data[3] = 5.60519e-45;
                  local_30.m_data[0] = 1.96182e-44;
                  local_30.m_data[1] = 0.0;
                  local_30.m_data[2] = 0.0;
                  local_30.m_data[3] = 1.4013e-45;
                  bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                          Read<tcu::Vector<unsigned_int,4>>
                                    ((BasicAllFormatsLoadStoreComputeStage *)this,0x8236,
                                     (Vector<unsigned_int,_4> *)&local_20,
                                     (Vector<unsigned_int,_4> *)&local_30,0x8d94,0x1405);
                  if (bVar1) {
                    local_20.m_data[0] = 0.0;
                    local_20.m_data[1] = 1.4013e-45;
                    local_20.m_data[2] = 2.8026e-45;
                    local_20.m_data[3] = 4.2039e-45;
                    local_30.m_data[0] = 0.0;
                    local_30.m_data[1] = 2.8026e-45;
                    local_30.m_data[2] = 5.60519e-45;
                    local_30.m_data[3] = 8.40779e-45;
                    bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                            Read<tcu::Vector<unsigned_int,4>>
                                      ((BasicAllFormatsLoadStoreComputeStage *)this,0x8d76,
                                       (Vector<unsigned_int,_4> *)&local_20,
                                       (Vector<unsigned_int,_4> *)&local_30,0x8d99,0x1403);
                    if (bVar1) {
                      local_20.m_data[0] = 0.0;
                      local_20.m_data[1] = 1.4013e-45;
                      local_20.m_data[2] = 2.8026e-45;
                      local_20.m_data[3] = 4.2039e-45;
                      local_30.m_data[0] = 0.0;
                      local_30.m_data[1] = 2.8026e-45;
                      local_30.m_data[2] = 5.60519e-45;
                      local_30.m_data[3] = 8.40779e-45;
                      bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                              Read<tcu::Vector<unsigned_int,4>>
                                        ((BasicAllFormatsLoadStoreComputeStage *)this,0x8d7c,
                                         (Vector<unsigned_int,_4> *)&local_20,
                                         (Vector<unsigned_int,_4> *)&local_30,0x8d99,0x1401);
                      if (bVar1) {
                        lVar2 = 0;
                        do {
                          local_20.m_data[lVar2] = 0.5;
                          lVar2 = lVar2 + 1;
                        } while (lVar2 != 4);
                        lVar2 = 0;
                        do {
                          local_30.m_data[lVar2] = 1.0;
                          lVar2 = lVar2 + 1;
                        } while (lVar2 != 4);
                        bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                                Read<tcu::Vector<float,4>>
                                          ((BasicAllFormatsLoadStoreComputeStage *)this,0x8058,
                                           &local_20,&local_30,0x1908,0x1401);
                        if (bVar1) {
                          local_20.m_data[0] = 0.5;
                          local_20.m_data[1] = 0.0;
                          local_20.m_data[2] = 0.5;
                          local_20.m_data[3] = -0.5;
                          local_30.m_data[0] = 1.0;
                          local_30.m_data[1] = 0.0;
                          local_30.m_data[2] = 1.0;
                          local_30.m_data[3] = -1.0;
                          bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage
                                  ::Read<tcu::Vector<float,4>>
                                            ((BasicAllFormatsLoadStoreComputeStage *)this,0x8f97,
                                             &local_20,&local_30,0x1908,0x1400);
                          lVar3 = (ulong)bVar1 - 1;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return lVar3;
}

Assistant:

virtual long Run()
	{

		if (!Read(GL_RGBA32F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(2.0f, 4.0f, 6.0f, 8.0f), GL_RGBA, GL_FLOAT))
			return ERROR;
		if (!Read(GL_R32F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(2.0f, 0.0f, 0.0f, 1.0f), GL_RED, GL_FLOAT))
			return ERROR;
		if (!Read(GL_RGBA16F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(2.0f, 4.0f, 6.0f, 8.0f), GL_RGBA, GL_FLOAT))
			return ERROR;

		if (!Read(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(2, -4, 6, -8), GL_RGBA_INTEGER, GL_INT))
			return ERROR;
		if (!Read(GL_R32I, ivec4(1, -2, 3, -4), ivec4(2, 0, 0, 1), GL_RED_INTEGER, GL_INT))
			return ERROR;
		if (!Read(GL_RGBA16I, ivec4(1, -2, 3, -4), ivec4(2, -4, 6, -8), GL_RGBA_INTEGER, GL_SHORT))
			return ERROR;
		if (!Read(GL_RGBA8I, ivec4(1, -2, 3, -4), ivec4(2, -4, 6, -8), GL_RGBA_INTEGER, GL_BYTE))
			return ERROR;

		if (!Read(GL_RGBA32UI, uvec4(0, 1, 2, 3), uvec4(0, 2, 4, 6), GL_RGBA_INTEGER, GL_UNSIGNED_INT))
			return ERROR;
		if (!Read(GL_R32UI, uvec4(7, 2, 3, 4), uvec4(14, 0, 0, 1), GL_RED_INTEGER, GL_UNSIGNED_INT))
			return ERROR;
		if (!Read(GL_RGBA16UI, uvec4(0, 1, 2, 3), uvec4(0, 2, 4, 6), GL_RGBA_INTEGER, GL_UNSIGNED_SHORT))
			return ERROR;
		if (!Read(GL_RGBA8UI, uvec4(0, 1, 2, 3), uvec4(0, 2, 4, 6), GL_RGBA_INTEGER, GL_UNSIGNED_BYTE))
			return ERROR;

		if (!Read(GL_RGBA8, vec4(0.5f), vec4(1.0f), GL_RGBA, GL_UNSIGNED_BYTE))
			return ERROR;
		if (!Read(GL_RGBA8_SNORM, vec4(0.5f, 0.0f, 0.5f, -0.5f), vec4(1.0f, 0.0f, 1.0f, -1.0f), GL_RGBA, GL_BYTE))
			return ERROR;

		return NO_ERROR;
	}